

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O1

bool __thiscall Clasp::Asp::Preprocessor::classifyProgram(Preprocessor *this,VarVec *supported)

{
  size_type sVar1;
  PrgNode PVar2;
  bool bVar3;
  PrgBody *pPVar4;
  PrgAtom *pPVar5;
  ulong uVar6;
  Var bodyId_00;
  uint uVar7;
  ulong uVar8;
  Var bodyId;
  uint local_3c;
  VarVec *local_38;
  
  (this->follow_).ebo_.size = 0;
  bVar3 = LogicProgram::propagate(this->prg_,true);
  uVar8 = 0;
  if (bVar3) {
    local_38 = &this->follow_;
    do {
      uVar7 = 0;
      while( true ) {
        sVar1 = (this->follow_).ebo_.size;
        bodyId_00 = 0x40000000;
        if (uVar7 != sVar1 && sVar1 != 0) {
          if (this->dfs_ == true) {
            bodyId_00 = (this->follow_).ebo_.buf[sVar1 - 1];
            (this->follow_).ebo_.size = sVar1 - 1;
          }
          else {
            uVar6 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            bodyId_00 = (local_38->ebo_).buf[uVar6];
          }
        }
        local_3c = bodyId_00;
        if (bodyId_00 == 0x40000000) break;
        pPVar4 = addBodyVar(this,bodyId_00);
        pPVar5 = LogicProgram::getTrueAtom(this->prg_);
        if ((((ulong)(pPVar5->super_PrgHead).super_PrgNode & 0x7fffffff) != 0) ||
           (bVar3 = addHeadsToUpper(this,pPVar4), !bVar3)) goto LAB_00181031;
      }
      (this->follow_).ebo_.size = 0;
      if ((uint)uVar8 < (supported->ebo_).size) {
        uVar8 = uVar8 & 0xffffffff;
        do {
          local_3c = (supported->ebo_).buf[uVar8];
          pPVar4 = (this->prg_->bodies_).ebo_.buf[local_3c];
          if ((-1 < (int)(this->bodyInfo_).ebo_.buf[local_3c]) &&
             (((ulong)pPVar4->super_PrgNode & 0x4000000000000000) == 0)) {
            bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (local_38,&local_3c);
            break;
          }
          PVar2 = pPVar4->super_PrgNode;
          if ((PVar2._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar2 & 0x4000000000000000) != 0) {
            pPVar4->super_PrgNode = (PrgNode)(((ulong)PVar2 & 0xffffffff80000000) + 1);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (supported->ebo_).size);
      }
    } while ((this->follow_).ebo_.size != 0);
LAB_00181031:
    if (bodyId_00 == 0x40000000) {
      pPVar5 = LogicProgram::getTrueAtom(this->prg_);
      uVar8 = (ulong)(((ulong)(pPVar5->super_PrgHead).super_PrgNode & 0x7fffffff) == 0);
    }
    else {
      uVar8 = 0;
    }
  }
  return SUB81(uVar8,0);
}

Assistant:

bool Preprocessor::classifyProgram(const VarVec& supported) {
	Var bodyId; PrgBody* body;
	VarVec::size_type index = 0;
	follow_.clear();
	if (!prg_->propagate(true)) { return false; }
	for (VarVec::size_type i = 0;;) {
		while ( (bodyId = nextBodyId(index)) != varMax ) {
			body = addBodyVar(bodyId);
			if (prg_->hasConflict())    { return false; }
			if (!addHeadsToUpper(body)) { return false; }
		}
		follow_.clear();
		index = 0;
		// select next unclassified supported body
		for (; i < supported.size(); ++i) {
			bodyId  = supported[i];
			body    = prg_->getBody(bodyId);
			if (bodyInfo_[bodyId].bSeen == 0 && body->relevant()) {
				follow_.push_back(bodyId);
				break;
			}
			else if (!body->relevant() && body->hasVar()) {
				body->clearLiteral(false);
			}
		}
		if (follow_.empty()) break;
	}
	return !prg_->hasConflict();
}